

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O2

void t1(int pi)

{
  int iVar1;
  
  puts("Mode/PUD/read/write tests.");
  set_mode(pi,0x19,0);
  iVar1 = get_mode(pi,0x19);
  CHECK(1,1,iVar1,0,0,"set mode, get mode");
  set_pull_up_down(pi,0x19,2);
  iVar1 = gpio_read(pi,0x19);
  CHECK(1,2,iVar1,1,0,"set pull up down, read");
  set_pull_up_down(pi,0x19,1);
  iVar1 = gpio_read(pi,0x19);
  CHECK(1,3,iVar1,0,0,"set pull up down, read");
  gpio_write(pi,0x19,0);
  iVar1 = get_mode(pi,0x19);
  CHECK(1,4,iVar1,1,0,"write, get mode");
  iVar1 = gpio_read(pi,0x19);
  CHECK(1,5,iVar1,0,0,"read");
  gpio_write(pi,0x19,1);
  iVar1 = gpio_read(pi,0x19);
  CHECK(1,6,iVar1,1,0,"write, read");
  return;
}

Assistant:

void t1(int pi)
{
   int v;

   printf("Mode/PUD/read/write tests.\n");

   set_mode(pi, GPIO, PI_INPUT);
   v = get_mode(pi, GPIO);
   CHECK(1, 1, v, 0, 0, "set mode, get mode");

   set_pull_up_down(pi, GPIO, PI_PUD_UP);
   v = gpio_read(pi, GPIO);
   CHECK(1, 2, v, 1, 0, "set pull up down, read");

   set_pull_up_down(pi, GPIO, PI_PUD_DOWN);
   v = gpio_read(pi, GPIO);
   CHECK(1, 3, v, 0, 0, "set pull up down, read");

   gpio_write(pi, GPIO, PI_LOW);
   v = get_mode(pi, GPIO);
   CHECK(1, 4, v, 1, 0, "write, get mode");

   v = gpio_read(pi, GPIO);
   CHECK(1, 5, v, 0, 0, "read");

   gpio_write(pi, GPIO, PI_HIGH);
   v = gpio_read(pi, GPIO);
   CHECK(1, 6, v, 1, 0, "write, read");
}